

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transform.cpp
# Opt level: O0

Transform * __thiscall
sf::Transform::scale(Transform *this,float scaleX,float scaleY,float centerX,float centerY)

{
  Transform *pTVar1;
  Transform *in_RDI;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  Transform *unaff_retaddr;
  Transform scaling;
  Transform local_58;
  
  Transform(&local_58,in_XMM0_Da,0.0,in_XMM2_Da * (1.0 - in_XMM0_Da),0.0,in_XMM1_Da,
            in_XMM3_Da * (1.0 - in_XMM1_Da),0.0,0.0,1.0);
  pTVar1 = combine(unaff_retaddr,in_RDI);
  return pTVar1;
}

Assistant:

Transform& Transform::scale(float scaleX, float scaleY, float centerX, float centerY)
{
    Transform scaling(scaleX, 0,      centerX * (1 - scaleX),
                      0,      scaleY, centerY * (1 - scaleY),
                      0,      0,      1);

    return combine(scaling);
}